

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enet.h
# Opt level: O2

int enet_protocol_check_outgoing_commands
              (ENetHost *host,ENetPeer *peer,ENetList *sentUnreliableCommands)

{
  short *psVar1;
  byte *pbVar2;
  ENetList *pEVar3;
  ENetList *pEVar4;
  byte bVar5;
  ushort uVar6;
  short sVar7;
  short sVar8;
  enet_uint32 eVar9;
  ENetChannel *pEVar10;
  size_t sVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  long lVar23;
  _ENetListNode *p_Var24;
  ulong uVar25;
  byte bVar26;
  uint uVar27;
  int iVar28;
  ulong uVar29;
  bool bVar30;
  _ENetListNode *p_Var31;
  long lVar32;
  ENetPacket *packet;
  _ENetListNode *p_Var33;
  undefined8 *puVar34;
  undefined4 *puVar35;
  int iVar36;
  ENetListIterator result;
  _ENetListNode *p_Var37;
  _ENetListNode *p_Var38;
  _ENetListNode *local_78;
  long *local_68;
  
  lVar23 = host->commandCount * 0x30 + 0x72;
  lVar32 = host->bufferCount * 0x10 + 0x680;
  p_Var33 = (peer->outgoingCommands).sentinel.next;
  local_78 = (peer->outgoingSendReliableCommands).sentinel.next;
  pEVar3 = &peer->outgoingSendReliableCommands;
  pEVar4 = &peer->sentReliableCommands;
  iVar36 = 1;
  bVar30 = true;
LAB_00107b1a:
  p_Var24 = local_78;
  p_Var38 = p_Var33;
LAB_00107b44:
  do {
    if (p_Var38 == &(peer->outgoingCommands).sentinel) {
      if (p_Var24 == &pEVar3->sentinel) goto LAB_00107f97;
LAB_00107b76:
      p_Var31 = p_Var24->next;
      p_Var33 = p_Var38;
      p_Var37 = p_Var24;
      local_78 = p_Var31;
    }
    else {
      if ((p_Var24 != &pEVar3->sentinel) &&
         (86399999 <
          (uint)(*(int *)((long)&p_Var24[1].previous + 4) - *(int *)((long)&p_Var38[1].previous + 4)
                ))) goto LAB_00107b76;
      p_Var31 = p_Var38->next;
      p_Var33 = p_Var31;
      p_Var37 = p_Var38;
      local_78 = p_Var24;
    }
    bVar5 = *(byte *)&p_Var37[2].previous;
    iVar28 = iVar36;
    if (-1 < (char)bVar5) break;
    uVar25 = (ulong)*(byte *)((long)&p_Var37[2].previous + 1);
    if (((uVar25 < peer->channelCount) && (pEVar10 = peer->channels, pEVar10 != (ENetChannel *)0x0))
       && ((p_Var24 = local_78, !bVar30 ||
           ((uVar6 = *(ushort *)&p_Var37[1].next,
            (uVar6 & 0xfff) == 0 && *(short *)((long)&p_Var37[2].next + 6) == 0 &&
            ((p_Var24 = &pEVar3->sentinel,
             0xfff < pEVar10[uVar25].reliableWindows[(uVar6 >> 0xc) - 1 & 0xf] ||
             (bVar26 = (byte)(uVar6 >> 0xc),
             ((0x3ffU >> (0x10 - bVar26 & 0x1f) | 0x3ff << bVar26) &
             (uint)pEVar10[uVar25].usedReliableWindows) != 0)))))))) goto LAB_00107d5e;
    iVar28 = 0;
    if (p_Var37[5].previous == (_ENetListNode *)0x0) break;
    uVar27 = peer->windowSize * peer->packetThrottle >> 5;
    if (uVar27 <= peer->mtu) {
      uVar27 = peer->mtu;
    }
    p_Var24 = &pEVar3->sentinel;
    p_Var38 = p_Var33;
  } while (uVar27 < (uint)*(ushort *)((long)&p_Var37[2].next + 4) + peer->reliableDataInTransit);
  iVar36 = iVar28;
  if (lVar32 < 0xa80 && lVar23 < 0x672) {
    uVar25 = commandSizes[bVar5 & 0xf];
    sVar11 = host->packetSize;
    uVar29 = peer->mtu - sVar11;
    if (uVar25 <= uVar29) {
      packet = (ENetPacket *)p_Var37[5].previous;
      if (packet == (ENetPacket *)0x0) {
        local_68 = (long *)((long)host->commands + lVar32 + -0x62);
        if (-1 < (char)bVar5) {
          p_Var24 = p_Var37->previous;
          p_Var24->next = p_Var31;
          p_Var31->previous = p_Var24;
          goto LAB_00107f00;
        }
      }
      else {
        if (((uint)uVar29 & 0xffff) <
            (uint)(ushort)(*(short *)((long)&p_Var37[2].next + 4) + (short)uVar25))
        goto LAB_00107f90;
        if (-1 < (char)bVar5) {
          if ((*(int *)&p_Var37[2].next == 0) &&
             (uVar27 = peer->packetThrottleCounter + 7 & 0x1f, peer->packetThrottleCounter = uVar27,
             peer->packetThrottle < uVar27)) {
            sVar7 = *(short *)&p_Var37[1].next;
            sVar8 = *(short *)((long)&p_Var37[1].next + 2);
            while( true ) {
              p_Var38 = p_Var33;
              packet->referenceCount = packet->referenceCount - 1;
              if (packet->referenceCount == 0) {
                enet_packet_destroy(packet);
                p_Var31 = p_Var37->next;
              }
              p_Var33 = p_Var37->previous;
              p_Var33->next = p_Var31;
              p_Var31->previous = p_Var33;
              (*callbacks.free)(p_Var37);
              p_Var24 = local_78;
              if (((p_Var38 == &(peer->outgoingCommands).sentinel) ||
                  (*(short *)&p_Var38[1].next != sVar7)) ||
                 (*(short *)((long)&p_Var38[1].next + 2) != sVar8)) break;
              p_Var31 = p_Var38->next;
              packet = (ENetPacket *)p_Var38[5].previous;
              p_Var33 = p_Var31;
              p_Var37 = p_Var38;
            }
            goto LAB_00107b44;
          }
          local_68 = (long *)((long)host->commands + lVar32 + -0x62);
          p_Var24 = p_Var37->previous;
          p_Var24->next = p_Var31;
          p_Var31->previous = p_Var24;
          p_Var24 = (sentUnreliableCommands->sentinel).previous;
          p_Var37->previous = p_Var24;
          p_Var37->next = &sentUnreliableCommands->sentinel;
          p_Var24->next = p_Var37;
          (sentUnreliableCommands->sentinel).previous = p_Var37;
          goto LAB_00107f00;
        }
        local_68 = (long *)((long)host->commands + lVar32 + -0x62);
      }
      uVar29 = (ulong)*(byte *)((long)&p_Var37[2].previous + 1);
      if (((uVar29 < peer->channelCount) &&
          (pEVar10 = peer->channels, pEVar10 != (ENetChannel *)0x0)) &&
         (*(short *)((long)&p_Var37[2].next + 6) == 0)) {
        uVar6 = *(ushort *)&p_Var37[1].next;
        pEVar10[uVar29].usedReliableWindows =
             pEVar10[uVar29].usedReliableWindows | (ushort)(1 << (byte)(uVar6 >> 0xc));
        pEVar10[uVar29].reliableWindows[uVar6 >> 0xc] =
             pEVar10[uVar29].reliableWindows[uVar6 >> 0xc] + 1;
      }
      psVar1 = (short *)((long)&p_Var37[2].next + 6);
      *psVar1 = *psVar1 + 1;
      iVar28 = *(int *)&p_Var37[1].previous;
      if (iVar28 == 0) {
        iVar28 = peer->roundTripTimeVariance * 4 + peer->roundTripTime;
        *(int *)&p_Var37[1].previous = iVar28;
      }
      eVar9 = host->serviceTime;
      if ((pEVar4->sentinel).next == &pEVar4->sentinel) {
        peer->nextTimeout = iVar28 + eVar9;
      }
      p_Var24 = p_Var37->previous;
      p_Var24->next = p_Var31;
      p_Var31->previous = p_Var24;
      p_Var24 = (peer->sentReliableCommands).sentinel.previous;
      p_Var37->previous = p_Var24;
      p_Var37->next = &pEVar4->sentinel;
      p_Var24->next = p_Var37;
      (peer->sentReliableCommands).sentinel.previous = p_Var37;
      *(enet_uint32 *)((long)&p_Var37[1].next + 4) = eVar9;
      pbVar2 = (byte *)((long)&host->headerFlags + 1);
      *pbVar2 = *pbVar2 | 0x80;
      peer->reliableDataInTransit =
           peer->reliableDataInTransit + (uint)*(ushort *)((long)&p_Var37[2].next + 4);
LAB_00107f00:
      puVar35 = (undefined4 *)((long)host->commands + lVar23 + -0x72);
      puVar34 = (undefined8 *)((long)host->commands + lVar32 + -0x72);
      *puVar34 = puVar35;
      puVar34[1] = uVar25;
      host->packetSize = sVar11 + uVar25;
      uVar12 = *(undefined4 *)&p_Var37[2].previous;
      uVar13 = *(undefined4 *)((long)&p_Var37[2].previous + 4);
      uVar14 = *(undefined4 *)&p_Var37[3].next;
      uVar15 = *(undefined4 *)((long)&p_Var37[3].next + 4);
      uVar16 = *(undefined4 *)&p_Var37[3].previous;
      uVar17 = *(undefined4 *)((long)&p_Var37[3].previous + 4);
      uVar18 = *(undefined4 *)&p_Var37[4].next;
      uVar19 = *(undefined4 *)((long)&p_Var37[4].next + 4);
      uVar20 = *(undefined4 *)((long)&p_Var37[4].previous + 4);
      uVar21 = *(undefined4 *)&p_Var37[5].next;
      uVar22 = *(undefined4 *)((long)&p_Var37[5].next + 4);
      puVar35[8] = *(undefined4 *)&p_Var37[4].previous;
      puVar35[9] = uVar20;
      puVar35[10] = uVar21;
      puVar35[0xb] = uVar22;
      puVar35[4] = uVar16;
      puVar35[5] = uVar17;
      puVar35[6] = uVar18;
      puVar35[7] = uVar19;
      *puVar35 = uVar12;
      puVar35[1] = uVar13;
      puVar35[2] = uVar14;
      puVar35[3] = uVar15;
      if (p_Var37[5].previous == (_ENetListNode *)0x0) {
        if (-1 < *(char *)&p_Var37[2].previous) {
          (*callbacks.free)(p_Var37);
        }
      }
      else {
        *local_68 = (long)&(p_Var37[5].previous[1].next)->next + (ulong)*(uint *)&p_Var37[2].next;
        uVar25 = (ulong)*(ushort *)((long)&p_Var37[2].next + 4);
        local_68[1] = uVar25;
        host->packetSize = host->packetSize + uVar25;
        lVar32 = lVar32 + 0x10;
      }
      peer->packetsSent = peer->packetsSent + 1;
      peer->totalPacketsSent = peer->totalPacketsSent + 1;
      lVar23 = lVar23 + 0x30;
      lVar32 = lVar32 + 0x10;
      goto LAB_00107b1a;
    }
  }
LAB_00107f90:
  *(byte *)&peer->flags = (byte)peer->flags | 2;
LAB_00107f97:
  host->commandCount = (lVar23 + -0x72) / 0x30;
  host->bufferCount = lVar32 + -0x680 >> 4;
  if (((peer->state == ENET_PEER_STATE_DISCONNECT_LATER) &&
      (iVar28 = enet_peer_has_outgoing_commands(peer), iVar28 == 0)) &&
     ((sentUnreliableCommands->sentinel).next == &sentUnreliableCommands->sentinel)) {
    enet_peer_disconnect(peer,peer->eventData);
  }
  return iVar36;
LAB_00107d5e:
  local_78 = p_Var24;
  bVar30 = false;
  goto LAB_00107b1a;
}

Assistant:

static int enet_protocol_check_outgoing_commands(ENetHost *host, ENetPeer *peer, ENetList *sentUnreliableCommands) {
        ENetProtocol *command = &host->commands[host->commandCount];
        ENetBuffer *buffer    = &host->buffers[host->bufferCount];
        ENetOutgoingCommand *outgoingCommand = NULL;
        ENetListIterator currentCommand, currentSendReliableCommand;
        ENetChannel *channel = NULL;
        enet_uint16 reliableWindow = 0;
        size_t commandSize=0;
        int windowWrap = 0, canPing = 1;

        currentCommand = enet_list_begin(&peer->outgoingCommands);
        currentSendReliableCommand = enet_list_begin (&peer->outgoingSendReliableCommands);

        for (;;) {
            if (currentCommand != enet_list_end (& peer->outgoingCommands))
            {
                outgoingCommand = (ENetOutgoingCommand *) currentCommand;
                if (currentSendReliableCommand != enet_list_end (& peer->outgoingSendReliableCommands) && ENET_TIME_LESS (((ENetOutgoingCommand *) currentSendReliableCommand)->queueTime, outgoingCommand->queueTime)) {
                    goto useSendReliableCommand;
                }
                currentCommand = enet_list_next (currentCommand);
            } else if (currentSendReliableCommand != enet_list_end (& peer->outgoingSendReliableCommands)) {
                useSendReliableCommand:
                outgoingCommand = (ENetOutgoingCommand *) currentSendReliableCommand;
                currentSendReliableCommand = enet_list_next (currentSendReliableCommand);
            } else {
                break;
            }


            if (outgoingCommand->command.header.command & ENET_PROTOCOL_COMMAND_FLAG_ACKNOWLEDGE) {
                channel = outgoingCommand->command.header.channelID < peer->channelCount ? & peer->channels [outgoingCommand->command.header.channelID] : NULL;
                reliableWindow = outgoingCommand->reliableSequenceNumber / ENET_PEER_RELIABLE_WINDOW_SIZE;
                if (channel != NULL) {
                    if (windowWrap) {
                        continue;
                    } else if (outgoingCommand->sendAttempts < 1 && 
                            !(outgoingCommand->reliableSequenceNumber % ENET_PEER_RELIABLE_WINDOW_SIZE) &&
                            (channel->reliableWindows [(reliableWindow + ENET_PEER_RELIABLE_WINDOWS - 1) % ENET_PEER_RELIABLE_WINDOWS] >= ENET_PEER_RELIABLE_WINDOW_SIZE ||
                            channel->usedReliableWindows & ((((1u << (ENET_PEER_FREE_RELIABLE_WINDOWS + 2)) - 1) << reliableWindow) | 
                            (((1u << (ENET_PEER_FREE_RELIABLE_WINDOWS + 2)) - 1) >> (ENET_PEER_RELIABLE_WINDOWS - reliableWindow))))) 
                    {
                        windowWrap = 1;
                        currentSendReliableCommand = enet_list_end (& peer->outgoingSendReliableCommands);
                        continue;
                    }
                }

                if (outgoingCommand->packet != NULL) {
                    enet_uint32 windowSize = (peer->packetThrottle * peer->windowSize) / ENET_PEER_PACKET_THROTTLE_SCALE;

                    if (peer->reliableDataInTransit + outgoingCommand->fragmentLength > ENET_MAX (windowSize, peer->mtu))
                    {
                        currentSendReliableCommand = enet_list_end (& peer->outgoingSendReliableCommands);
                        continue;
                    }
                }

                canPing = 0;
            }

            commandSize = commandSizes[outgoingCommand->command.header.command & ENET_PROTOCOL_COMMAND_MASK];
            if (command >= &host->commands[sizeof(host->commands) / sizeof(ENetProtocol)] ||
                buffer + 1 >= &host->buffers[sizeof(host->buffers) / sizeof(ENetBuffer)] ||
                peer->mtu - host->packetSize < commandSize ||
                (outgoingCommand->packet != NULL &&
                (enet_uint16) (peer->mtu - host->packetSize) < (enet_uint16) (commandSize + outgoingCommand->fragmentLength))
            ) {
                peer->flags |= ENET_PEER_FLAG_CONTINUE_SENDING;
                break;
            }

            if (outgoingCommand->command.header.command & ENET_PROTOCOL_COMMAND_FLAG_ACKNOWLEDGE) {
                channel = outgoingCommand->command.header.channelID < peer->channelCount ? & peer->channels [outgoingCommand->command.header.channelID] : NULL;
                reliableWindow = outgoingCommand->reliableSequenceNumber / ENET_PEER_RELIABLE_WINDOW_SIZE;
                if (channel != NULL && outgoingCommand->sendAttempts < 1) {
                    channel->usedReliableWindows |= 1u << reliableWindow;
                    ++channel->reliableWindows[reliableWindow];
                }

                ++outgoingCommand->sendAttempts;

                if (outgoingCommand->roundTripTimeout == 0) {
                    outgoingCommand->roundTripTimeout = peer->roundTripTime + 4 * peer->roundTripTimeVariance;
                }

                if (enet_list_empty(&peer->sentReliableCommands)) {
                    peer->nextTimeout = host->serviceTime + outgoingCommand->roundTripTimeout;
                }

                enet_list_insert(enet_list_end(&peer->sentReliableCommands), enet_list_remove(&outgoingCommand->outgoingCommandList));

                outgoingCommand->sentTime = host->serviceTime;

                host->headerFlags |= ENET_PROTOCOL_HEADER_FLAG_SENT_TIME;
                peer->reliableDataInTransit += outgoingCommand->fragmentLength;
            } else {
                if (outgoingCommand->packet != NULL && outgoingCommand->fragmentOffset == 0) {
                    peer->packetThrottleCounter += ENET_PEER_PACKET_THROTTLE_COUNTER;
                    peer->packetThrottleCounter %= ENET_PEER_PACKET_THROTTLE_SCALE;

                    if (peer->packetThrottleCounter > peer->packetThrottle) {
                        enet_uint16 reliableSequenceNumber = outgoingCommand->reliableSequenceNumber,
                                    unreliableSequenceNumber = outgoingCommand->unreliableSequenceNumber;
                        for (;;)
                        {
                            --outgoingCommand->packet->referenceCount;

                            if (outgoingCommand->packet->referenceCount == 0) {
                                enet_packet_destroy(outgoingCommand->packet);
                            }

                            enet_list_remove(& outgoingCommand->outgoingCommandList);
                            enet_free(outgoingCommand);

                            if (currentCommand == enet_list_end (& peer->outgoingCommands)) {
                                break;
                            }

                            outgoingCommand = (ENetOutgoingCommand *) currentCommand;
                            if (outgoingCommand->reliableSequenceNumber != reliableSequenceNumber ||
                                outgoingCommand->unreliableSequenceNumber != unreliableSequenceNumber) {
                                break;
                            }

                            currentCommand = enet_list_next(currentCommand);
                        }

                        continue;
                    }
                }

                enet_list_remove(&outgoingCommand->outgoingCommandList);

                if (outgoingCommand->packet != NULL) {
                    enet_list_insert(enet_list_end (sentUnreliableCommands), outgoingCommand);
                }
            }


            buffer->data       = command;
            buffer->dataLength = commandSize;

            host->packetSize  += buffer->dataLength;

            *command = outgoingCommand->command;

            if (outgoingCommand->packet != NULL) {
                ++buffer;
                buffer->data       = outgoingCommand->packet->data + outgoingCommand->fragmentOffset;
                buffer->dataLength = outgoingCommand->fragmentLength;
                host->packetSize += outgoingCommand->fragmentLength;
            } else if(! (outgoingCommand->command.header.command & ENET_PROTOCOL_COMMAND_FLAG_ACKNOWLEDGE)) {
                enet_free(outgoingCommand);
            }

            ++peer->packetsSent;
            ++peer->totalPacketsSent;

            ++command;
            ++buffer;
        }

        host->commandCount = command - host->commands;
        host->bufferCount  = buffer - host->buffers;

        if (peer->state == ENET_PEER_STATE_DISCONNECT_LATER &&
            !enet_peer_has_outgoing_commands (peer) &&
            enet_list_empty (sentUnreliableCommands)) {
                enet_peer_disconnect (peer, peer->eventData);
            }

        return canPing;
    }